

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack21_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar17 [64];
  
  auVar10 = *(undefined1 (*) [32])(in + 1);
  auVar12 = vpmovsxbd_avx512f(_DAT_001a0930);
  uVar5 = *in;
  uVar1 = in[0x14];
  auVar11 = vpsllvd_avx2(auVar10,_DAT_0019d500);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(in + 10);
  auVar7 = vpsllvd_avx2(auVar7,_DAT_001a08d0);
  auVar11 = vpand_avx2(auVar11,_DAT_0019d520);
  *out = uVar5 & 0x1fffff;
  auVar12 = vpermi2d_avx512f(auVar12,ZEXT3264(auVar10),ZEXT464(uVar5));
  auVar13 = vpmovsxbd_avx512f(_DAT_001a0940);
  auVar14 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(in + 9);
  auVar6 = vpsrlvd_avx2(auVar6,_DAT_001a08c0);
  auVar12 = vpermi2d_avx512f(auVar13,auVar12,ZEXT864(*(ulong *)(in + 9)));
  auVar13 = vpmovsxbd_avx512f(_DAT_001a0950);
  auVar10 = vpmovsxbd_avx2(ZEXT816(0x3020101000808));
  auVar12 = vpermt2q_avx512f(auVar12,auVar14,ZEXT1664(auVar7));
  auVar13 = vpermd_avx512f(auVar13,auVar12);
  auVar13 = vpsrlvd_avx512f(auVar13,_DAT_001b2980);
  auVar15 = vmovdqa64_avx512f(auVar13);
  auVar12 = vpandd_avx512f(auVar12,_DAT_001b29c0);
  auVar15._56_4_ = auVar12._56_4_;
  auVar15._60_4_ = auVar12._60_4_;
  auVar12 = vpmovsxbd_avx512f(_DAT_001a0960);
  auVar12 = vpermd_avx512f(auVar12,ZEXT3264(auVar11));
  auVar16 = vpbroadcastd_avx512f(ZEXT416(0x1fffff));
  auVar17 = vpbroadcastd_avx512f();
  auVar18._0_48_ = auVar12._0_48_;
  auVar18._48_4_ = auVar17._48_4_;
  auVar18._52_4_ = auVar12._52_4_;
  auVar18._56_4_ = auVar12._56_4_;
  auVar18._60_4_ = auVar12._60_4_;
  auVar12 = vpermt2q_avx512f(auVar18,auVar14,ZEXT1664(auVar6));
  uVar5 = in[0xb];
  auVar12 = vpord_avx512f(auVar15,auVar12);
  auVar8 = vpbroadcastd_avx512vl();
  uVar2 = *(ulong *)(in + 0x10);
  auVar13 = vpandd_avx512f(auVar13,auVar16);
  auVar14._4_4_ = auVar13._4_4_;
  auVar14._0_4_ = auVar12._0_4_;
  auVar14._8_4_ = auVar12._8_4_;
  auVar14._12_4_ = auVar12._12_4_;
  auVar14._16_4_ = auVar13._16_4_;
  auVar14._20_4_ = auVar12._20_4_;
  auVar14._24_4_ = auVar12._24_4_;
  auVar14._28_4_ = auVar13._28_4_;
  auVar14._32_4_ = auVar12._32_4_;
  auVar14._36_4_ = auVar12._36_4_;
  auVar14._40_4_ = auVar13._40_4_;
  auVar14._44_4_ = auVar12._44_4_;
  auVar14._48_4_ = auVar12._48_4_;
  auVar14._52_4_ = auVar13._52_4_;
  auVar14._56_4_ = auVar12._56_4_;
  auVar14._60_4_ = auVar12._60_4_;
  auVar12 = vmovdqu64_avx512f(auVar14);
  *(undefined1 (*) [64])(out + 1) = auVar12;
  auVar9 = vpbroadcastd_avx512vl();
  uVar3 = *(ulong *)(in + 0x12);
  auVar7 = vpshufd_avx(*(undefined1 (*) [16])(in + 0xc),0xe1);
  auVar7 = vpsllvd_avx2(auVar7,_DAT_001a08e0);
  auVar10 = vpermi2d_avx512vl(auVar10,ZEXT1632(*(undefined1 (*) [16])(in + 0xc)),ZEXT432(uVar5));
  auVar10 = vpsrlvd_avx2(auVar10,_DAT_0019d560);
  auVar11._8_4_ = 0x1fff00;
  auVar11._0_8_ = 0x1fff00001fff00;
  auVar11._12_4_ = 0x1fff00;
  auVar11._16_4_ = 0x1fff00;
  auVar11._20_4_ = 0x1fff00;
  auVar11._24_4_ = 0x1fff00;
  auVar11._28_4_ = 0x1fff00;
  auVar11 = vpandd_avx512vl(auVar9,auVar11);
  auVar7 = vpand_avx(auVar7,_DAT_001a08f0);
  auVar11 = vpblendd_avx2(auVar10,auVar11,0x80);
  auVar10 = vpand_avx2(auVar10,auVar16._0_32_);
  auVar9 = vpermq_avx2(ZEXT1632(auVar7),0xd0);
  auVar9 = vpblendd_avx2(auVar9,auVar8,0x80);
  auVar11 = vpor_avx2(auVar11,auVar9);
  auVar7 = vpmovsxbd_avx(ZEXT416(0x4010100));
  auVar10 = vpblendd_avx2(auVar11,auVar10,0x49);
  *(undefined1 (*) [32])(out + 0x11) = auVar10;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar3;
  auVar6 = vpsllvd_avx2(auVar19,_DAT_001a0900);
  auVar4._8_4_ = 0x1ffe00;
  auVar4._0_8_ = 0x100000001ffe00;
  auVar4._12_4_ = 0x100000;
  auVar6 = vpandq_avx512vl(auVar6,auVar4);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar2;
  auVar7 = vpermi2d_avx512vl(auVar7,auVar20,auVar19);
  auVar4 = vpsrlvd_avx2(auVar7,_DAT_001a0920);
  auVar7 = vpinsrd_avx(auVar16._0_16_,((uint)(uVar2 >> 0x20) & 3) << 0x13,0);
  uVar5 = (uint)(uVar3 >> 0x20);
  auVar7 = vpunpcklqdq_avx(auVar7,auVar6);
  auVar6 = vpor_avx(auVar4,auVar7);
  auVar7 = vpand_avx(auVar4,auVar16._0_16_);
  auVar7 = vpblendd_avx2(auVar6,auVar7,2);
  *(undefined1 (*) [16])(out + 0x19) = auVar7;
  out[0x1d] = uVar5 >> 1 & 0x1fffff;
  out[0x1e] = uVar5 >> 0x16 | (uVar1 & 0x7ff) << 10;
  out[0x1f] = uVar1 >> 0xb;
  return in + 0x15;
}

Assistant:

const uint32_t *__fastunpack21_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 10)) << (21 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 21);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 20)) << (21 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 9)) << (21 - 9);
  out++;
  *out = ((*in) >> 9) % (1U << 21);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 19)) << (21 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 8)) << (21 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 21);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 18)) << (21 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 7)) << (21 - 7);
  out++;
  *out = ((*in) >> 7) % (1U << 21);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 17)) << (21 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 6)) << (21 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 21);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 16)) << (21 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 5)) << (21 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 21);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 15)) << (21 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 4)) << (21 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 21);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 14)) << (21 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 3)) << (21 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 21);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 13)) << (21 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 2)) << (21 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 21);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 12)) << (21 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 1)) << (21 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 21);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 11)) << (21 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  out++;

  return in;
}